

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concurrent_index.cpp
# Opt level: O0

void TransactionalAppendToPK(DuckDB *db,idx_t thread_idx)

{
  initializer_list<duckdb::Value> iVar1;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  byte bVar2;
  bool bVar3;
  int iVar4;
  pointer pQVar5;
  pointer pDVar6;
  undefined8 uVar7;
  DuckDB *in_RDI;
  AssertionHandler catchAssertionHandler_4;
  AssertionHandler catchAssertionHandler_3;
  AssertionHandler catchAssertionHandler_2;
  idx_t i;
  int32_t initial_count;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> chunk;
  AssertionHandler catchAssertionHandler_1;
  AssertionHandler catchAssertionHandler;
  Connection con;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> result;
  undefined4 in_stack_fffffffffffff7a8;
  Flags in_stack_fffffffffffff7ac;
  AssertionHandler *in_stack_fffffffffffff7b0;
  AssertionHandler *this;
  StringRef *in_stack_fffffffffffff7b8;
  AssertionHandler *in_stack_fffffffffffff7c0;
  char *in_stack_fffffffffffff7c8;
  size_type in_stack_fffffffffffff7d0;
  SourceLineInfo *this_00;
  undefined8 in_stack_fffffffffffff7e8;
  string *in_stack_fffffffffffff7f0;
  Connection *in_stack_fffffffffffff7f8;
  vector<duckdb::Value,_true> *in_stack_fffffffffffff810;
  size_t in_stack_fffffffffffff818;
  unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
  *in_stack_fffffffffffff820;
  Value *local_798;
  string local_628 [32];
  undefined1 local_608 [151];
  allocator local_571;
  string local_570 [32];
  string local_550 [24];
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  string local_518 [48];
  StringRef local_4e8;
  SourceLineInfo local_4d8;
  StringRef local_4c8;
  Value *local_468;
  Value local_460 [64];
  Value *local_420;
  undefined8 local_418;
  allocator local_3f1;
  string local_3f0 [32];
  string local_3d0 [24];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  string local_398 [48];
  StringRef local_368;
  SourceLineInfo local_350;
  StringRef local_340;
  allocator local_2e1;
  string local_2e0 [40];
  ulong local_2b8;
  Value local_2b0 [68];
  int local_26c;
  undefined1 local_268 [16];
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  string local_238 [48];
  StringRef local_208;
  SourceLineInfo local_1f0;
  StringRef local_1e0;
  allocator local_181;
  string local_180 [32];
  string local_160 [24];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  string local_128 [48];
  StringRef local_f8;
  SourceLineInfo local_e8;
  StringRef local_d8;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  Connection local_38 [48];
  DuckDB *local_8;
  
  local_8 = in_RDI;
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             0x786434);
  duckdb::Connection::Connection(local_38,local_8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"BEGIN TRANSACTION",&local_79);
  duckdb::Connection::Query(local_58);
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x7864ec);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x7864f9);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0);
  bVar2 = duckdb::BaseQueryResult::HasError();
  if ((bVar2 & 1) != 0) {
    local_d8 = operator____catch_sr
                         ((char *)in_stack_fffffffffffff7b0,
                          CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
               ,0x113);
    local_f8.m_start = (char *)0x0;
    local_f8.m_size = 0;
    Catch::StringRef::StringRef(&local_f8);
    capturedExpression.m_size = in_stack_fffffffffffff7d0;
    capturedExpression.m_start = in_stack_fffffffffffff7c8;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
               (SourceLineInfo *)in_stack_fffffffffffff7b0,capturedExpression,
               in_stack_fffffffffffff7ac);
    local_148 = 0;
    uStack_140 = 0;
    local_138 = 0;
    Catch::MessageStream::MessageStream((MessageStream *)0x786605);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffff7b0);
    uVar7 = duckdb::BaseQueryResult::GetError_abi_cxx11_();
    Catch::operator+(uVar7);
    Catch::MessageStream::operator<<
              ((MessageStream *)in_stack_fffffffffffff7b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
              );
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffff7b0,
               (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::AssertionHandler::handleMessage
              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,(StringRef *)0x7866aa);
    std::__cxx11::string::~string(local_128);
    Catch::MessageStream::~MessageStream((MessageStream *)0x7866c6);
    Catch::AssertionHandler::complete(in_stack_fffffffffffff7b0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff7b0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"SELECT COUNT(*) FROM integers WHERE i >= 0",&local_181);
  duckdb::Connection::Query(local_160);
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x786871);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x78687e);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0);
  bVar2 = duckdb::BaseQueryResult::HasError();
  if ((bVar2 & 1) != 0) {
    local_1e0 = operator____catch_sr
                          ((char *)in_stack_fffffffffffff7b0,
                           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::SourceLineInfo::SourceLineInfo
              (&local_1f0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
               ,0x119);
    local_208.m_start = (char *)0x0;
    local_208.m_size = 0;
    Catch::StringRef::StringRef(&local_208);
    capturedExpression_00.m_size = in_stack_fffffffffffff7d0;
    capturedExpression_00.m_start = in_stack_fffffffffffff7c8;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
               (SourceLineInfo *)in_stack_fffffffffffff7b0,capturedExpression_00,
               in_stack_fffffffffffff7ac);
    local_258 = 0;
    uStack_250 = 0;
    local_248 = 0;
    Catch::MessageStream::MessageStream((MessageStream *)0x78698a);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffff7b0);
    uVar7 = duckdb::BaseQueryResult::GetError_abi_cxx11_();
    Catch::operator+(uVar7);
    Catch::MessageStream::operator<<
              ((MessageStream *)in_stack_fffffffffffff7b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
              );
    Catch::StringRef::StringRef
              ((StringRef *)in_stack_fffffffffffff7b0,
               (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::AssertionHandler::handleMessage
              (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,(StringRef *)0x786a2f);
    std::__cxx11::string::~string(local_238);
    Catch::MessageStream::~MessageStream((MessageStream *)0x786a4b);
    Catch::AssertionHandler::complete(in_stack_fffffffffffff7b0);
    Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff7b0);
  }
  pQVar5 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
           operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                       *)in_stack_fffffffffffff7b0);
  (**(code **)(*(long *)pQVar5 + 0x10))(local_268);
  pDVar6 = duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
           operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *
                      )in_stack_fffffffffffff7b0);
  duckdb::DataChunk::GetValue((ulong)local_2b0,(ulong)pDVar6);
  iVar4 = duckdb::Value::GetValue<int>();
  duckdb::Value::~Value(local_2b0);
  local_26c = iVar4;
  for (local_2b8 = 0; local_2b8 < 0x32; local_2b8 = local_2b8 + 1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2e0,"INSERT INTO integers VALUES ($1)",&local_2e1);
    duckdb::Connection::Query<int>
              (in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0,
               (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20));
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator=((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              in_stack_fffffffffffff7b0,
              (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                0x786c70);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffff7b0);
    bVar2 = duckdb::BaseQueryResult::HasError();
    if ((bVar2 & 1) != 0) {
      local_340 = operator____catch_sr
                            ((char *)in_stack_fffffffffffff7b0,
                             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::SourceLineInfo::SourceLineInfo
                (&local_350,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
                 ,0x123);
      local_368.m_start = (char *)0x0;
      local_368.m_size = 0;
      Catch::StringRef::StringRef(&local_368);
      capturedExpression_01.m_size = in_stack_fffffffffffff7d0;
      capturedExpression_01.m_start = in_stack_fffffffffffff7c8;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                 (SourceLineInfo *)in_stack_fffffffffffff7b0,capturedExpression_01,
                 in_stack_fffffffffffff7ac);
      local_3b8 = 0;
      uStack_3b0 = 0;
      local_3a8 = 0;
      Catch::MessageStream::MessageStream((MessageStream *)0x786d7c);
      duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
      operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                 in_stack_fffffffffffff7b0);
      uVar7 = duckdb::BaseQueryResult::GetError_abi_cxx11_();
      Catch::operator+(uVar7);
      Catch::MessageStream::operator<<
                ((MessageStream *)in_stack_fffffffffffff7b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::ReusableStringStream::str_abi_cxx11_
                ((ReusableStringStream *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffff7b0,
                 (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::AssertionHandler::handleMessage
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,(StringRef *)0x786e21);
      std::__cxx11::string::~string(local_398);
      Catch::MessageStream::~MessageStream((MessageStream *)0x786e3d);
      Catch::AssertionHandler::complete(in_stack_fffffffffffff7b0);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff7b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_3f0,"SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0",&local_3f1)
    ;
    duckdb::Connection::Query(local_3d0);
    duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
    unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
              ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffff7b0,
               (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
                *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator=((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              in_stack_fffffffffffff7b0,
              (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
                0x786fed);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x786ffa);
    std::__cxx11::string::~string(local_3f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    local_468 = local_460;
    duckdb::Value::INTEGER((int)local_468);
    local_420 = local_460;
    local_418 = 1;
    std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x787072);
    iVar1._M_len = (size_type)in_stack_fffffffffffff7c0;
    iVar1._M_array = (iterator)in_stack_fffffffffffff7b8;
    duckdb::vector<duckdb::Value,_true>::vector
              ((vector<duckdb::Value,_true> *)in_stack_fffffffffffff7b0,iVar1,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    bVar3 = duckdb::CHECK_COLUMN
                      (in_stack_fffffffffffff820,in_stack_fffffffffffff818,in_stack_fffffffffffff810
                      );
    duckdb::vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x7870d8);
    std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x7870e5);
    local_798 = (Value *)&local_420;
    do {
      local_798 = local_798 + -0x40;
      duckdb::Value::~Value(local_798);
    } while (local_798 != local_460);
    if (((bVar3 ^ 0xffU) & 1) != 0) {
      local_4c8 = operator____catch_sr
                            ((char *)in_stack_fffffffffffff7b0,
                             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::SourceLineInfo::SourceLineInfo
                (&local_4d8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
                 ,0x129);
      local_4e8.m_start = (char *)0x0;
      local_4e8.m_size = 0;
      Catch::StringRef::StringRef(&local_4e8);
      capturedExpression_02.m_size = in_stack_fffffffffffff7d0;
      capturedExpression_02.m_start = in_stack_fffffffffffff7c8;
      Catch::AssertionHandler::AssertionHandler
                (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
                 (SourceLineInfo *)in_stack_fffffffffffff7b0,capturedExpression_02,
                 in_stack_fffffffffffff7ac);
      local_538 = 0;
      uStack_530 = 0;
      local_528 = 0;
      Catch::MessageStream::MessageStream((MessageStream *)0x7871fc);
      operator+("Incorrect result in TransactionalAppendToPK");
      Catch::MessageStream::operator<<
                ((MessageStream *)in_stack_fffffffffffff7b0,
                 (char (*) [44])CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::ReusableStringStream::str_abi_cxx11_
                ((ReusableStringStream *)
                 CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::StringRef::StringRef
                ((StringRef *)in_stack_fffffffffffff7b0,
                 (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
      Catch::AssertionHandler::handleMessage
                (in_stack_fffffffffffff7b0,in_stack_fffffffffffff7ac,(StringRef *)0x787281);
      std::__cxx11::string::~string(local_518);
      Catch::MessageStream::~MessageStream((MessageStream *)0x78729d);
      Catch::AssertionHandler::complete(in_stack_fffffffffffff7b0);
      Catch::AssertionHandler::~AssertionHandler(in_stack_fffffffffffff7b0);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_570,"COMMIT",&local_571);
  duckdb::Connection::Query(local_550);
  duckdb::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>,true>::
  unique_ptr<duckdb::MaterializedQueryResult,std::default_delete<std::unique_ptr<duckdb::QueryResult,std::default_delete<duckdb::QueryResult>>>,void>
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>_>
              *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::operator=
            ((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0,
             (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x787508);
  duckdb::
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x787512);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
             in_stack_fffffffffffff7b0);
  bVar2 = duckdb::BaseQueryResult::HasError();
  if ((bVar2 & 1) != 0) {
    local_608._56_16_ =
         (undefined1  [16])
         operator____catch_sr
                   ((char *)in_stack_fffffffffffff7b0,
                    CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    this_00 = (SourceLineInfo *)(local_608 + 0x28);
    Catch::SourceLineInfo::SourceLineInfo
              (this_00,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sql/parallelism/interquery/test_concurrent_index.cpp"
               ,0x12f);
    local_608._16_8_ = (char *)0x0;
    local_608._24_8_ = 0;
    Catch::StringRef::StringRef((StringRef *)(local_608 + 0x10));
    capturedExpression_03.m_size = (size_type)this_00;
    capturedExpression_03.m_start = in_stack_fffffffffffff7c8;
    Catch::AssertionHandler::AssertionHandler
              (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
               (SourceLineInfo *)in_stack_fffffffffffff7b0,capturedExpression_03,
               in_stack_fffffffffffff7ac);
    Catch::MessageStream::MessageStream((MessageStream *)0x787609);
    duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
    operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
               in_stack_fffffffffffff7b0);
    uVar7 = duckdb::BaseQueryResult::GetError_abi_cxx11_();
    Catch::operator+(uVar7);
    Catch::MessageStream::operator<<
              ((MessageStream *)in_stack_fffffffffffff7b0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::ReusableStringStream::str_abi_cxx11_
              ((ReusableStringStream *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8)
              );
    this = (AssertionHandler *)local_608;
    Catch::StringRef::StringRef
              ((StringRef *)this,
               (string *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
    Catch::AssertionHandler::handleMessage(this,in_stack_fffffffffffff7ac,(StringRef *)0x787696);
    std::__cxx11::string::~string(local_628);
    Catch::MessageStream::~MessageStream((MessageStream *)0x7876b2);
    Catch::AssertionHandler::complete(this);
    Catch::AssertionHandler::~AssertionHandler(this);
  }
  duckdb::unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::~unique_ptr
            ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)0x787794
            );
  duckdb::Connection::~Connection(local_38);
  duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>::
  ~unique_ptr((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> *)
              0x7877ae);
  return;
}

Assistant:

static void TransactionalAppendToPK(DuckDB *db, idx_t thread_idx) {
	duckdb::unique_ptr<QueryResult> result;

	Connection con(*db);
	result = con.Query("BEGIN TRANSACTION");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	// get the initial count
	result = con.Query("SELECT COUNT(*) FROM integers WHERE i >= 0");
	if (result->HasError()) {
		FAIL(result->GetError());
	}

	auto chunk = result->Fetch();
	auto initial_count = chunk->GetValue(0, 0).GetValue<int32_t>();

	for (idx_t i = 0; i < 50; i++) {

		result = con.Query("INSERT INTO integers VALUES ($1)", (int32_t)(thread_idx * 1000 + i));
		if (result->HasError()) {
			FAIL(result->GetError());
		}

		// check the count
		result = con.Query("SELECT COUNT(*), COUNT(DISTINCT i) FROM integers WHERE i >= 0");
		if (!CHECK_COLUMN(result, 0, {Value::INTEGER(initial_count + i + 1)})) {
			FAIL("Incorrect result in TransactionalAppendToPK");
		}
	}

	result = con.Query("COMMIT");
	if (result->HasError()) {
		FAIL(result->GetError());
	}
}